

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_loader_impl.cpp
# Opt level: O2

loader_handle ext_loader_impl_load_from_file(loader_impl impl,loader_path *paths,size_t size)

{
  int iVar1;
  loader_impl_ext ext_impl;
  loader_impl_ext_handle ext_handle;
  long lVar2;
  
  ext_impl = (loader_impl_ext)loader_impl_get();
  if (ext_impl != (loader_impl_ext)0x0) {
    ext_handle = (loader_impl_ext_handle)operator_new(0x18);
    (ext_handle->extensions).
    super__Vector_base<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (ext_handle->extensions).
    super__Vector_base<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (ext_handle->extensions).
    super__Vector_base<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar2 = size + 1;
    do {
      lVar2 = lVar2 + -1;
      if (lVar2 == 0) {
        return ext_handle;
      }
      iVar1 = ext_loader_impl_load_from_file_handle(ext_impl,ext_handle,*paths);
      paths = paths + 1;
    } while (iVar1 == 0);
  }
  return (loader_handle)0x0;
}

Assistant:

loader_handle ext_loader_impl_load_from_file(loader_impl impl, const loader_path paths[], size_t size)
{
	loader_impl_ext ext_impl = static_cast<loader_impl_ext>(loader_impl_get(impl));

	if (ext_impl == NULL)
	{
		return NULL;
	}

	loader_impl_ext_handle ext_handle = new loader_impl_ext_handle_type();

	if (ext_handle == nullptr)
	{
		return NULL;
	}

	for (size_t iterator = 0; iterator < size; ++iterator)
	{
		if (ext_loader_impl_load_from_file_handle(ext_impl, ext_handle, paths[iterator]) != 0)
		{
			return NULL;
		}
	}

	return ext_handle;
}